

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

FieldSourceInfoBuilderPair * __thiscall
capnp::compiler::NodeTranslator::StructTranslator::MemberInfo::addMemberSchema
          (FieldSourceInfoBuilderPair *__return_storage_ptr__,MemberInfo *this)

{
  bool bVar1;
  FieldSourceInfoBuilderPair *result;
  Builder local_118;
  Builder local_f0;
  Builder local_c8;
  Builder local_a0;
  Builder local_78;
  undefined1 local_50 [8];
  Builder structNode;
  Fault local_18;
  Fault f;
  MemberInfo *this_local;
  
  f.exception = (Exception *)this;
  if (this->childInitializedCount < this->childCount) {
    capnp::schema::Node::Builder::getStruct((Builder *)local_50,&this->node);
    bVar1 = capnp::schema::Node::Struct::Builder::hasFields((Builder *)local_50);
    if (bVar1) {
      capnp::schema::Node::Struct::Builder::getFields(&local_f0,(Builder *)local_50);
      List<capnp::schema::Field,_(capnp::Kind)3>::Builder::operator[]
                (&__return_storage_ptr__->field,&local_f0,this->childInitializedCount);
      capnp::schema::Node::SourceInfo::Builder::getMembers(&local_118,&this->sourceInfo);
      List<capnp::schema::Node::SourceInfo::Member,_(capnp::Kind)3>::Builder::operator[]
                (&__return_storage_ptr__->sourceInfo,&local_118,this->childInitializedCount);
      this->childInitializedCount = this->childInitializedCount + 1;
    }
    else {
      if (this->parent != (MemberInfo *)0x0) {
        getSchema(&local_78,this);
      }
      capnp::schema::Node::Struct::Builder::initFields
                (&local_a0,(Builder *)local_50,this->childCount);
      List<capnp::schema::Field,_(capnp::Kind)3>::Builder::operator[]
                (&__return_storage_ptr__->field,&local_a0,this->childInitializedCount);
      capnp::schema::Node::SourceInfo::Builder::initMembers
                (&local_c8,&this->sourceInfo,this->childCount);
      List<capnp::schema::Node::SourceInfo::Member,_(capnp::Kind)3>::Builder::operator[]
                (&__return_storage_ptr__->sourceInfo,&local_c8,this->childInitializedCount);
      this->childInitializedCount = this->childInitializedCount + 1;
    }
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::Fault
            (&local_18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
             ,0x780,FAILED,"childInitializedCount < childCount","");
  kj::_::Debug::Fault::fatal(&local_18);
}

Assistant:

addMemberSchema() {
      // Get the schema builder for the child member at the given index.  This lazily/dynamically
      // builds the builder tree.

      KJ_REQUIRE(childInitializedCount < childCount);

      auto structNode = node.getStruct();
      if (!structNode.hasFields()) {
        if (parent != nullptr) {
          getSchema();  // Make sure field exists in parent once the first child is added.
        }
        FieldSourceInfoBuilderPair result {
          structNode.initFields(childCount)[childInitializedCount],
          sourceInfo.initMembers(childCount)[childInitializedCount]
        };
        ++childInitializedCount;
        return result;
      } else {
        FieldSourceInfoBuilderPair result {
          structNode.getFields()[childInitializedCount],
          sourceInfo.getMembers()[childInitializedCount]
        };
        ++childInitializedCount;
        return result;
      }
    }